

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.c
# Opt level: O2

void do_predict(FILE *input,FILE *output)

{
  char cVar1;
  model *pmVar2;
  feature_node *pfVar3;
  FILE *__stream;
  uint uVar4;
  int iVar5;
  int iVar6;
  void *__ptr;
  void *__ptr_00;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  int *piVar10;
  ushort **ppuVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  double extraout_XMM0_Qb;
  double extraout_XMM0_Qb_00;
  double dVar15;
  char *endptr;
  uint local_b4;
  FILE *local_b0;
  double local_a8;
  double dStack_a0;
  int local_90;
  int local_8c;
  void *local_88;
  FILE *local_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  
  local_80 = (FILE *)input;
  uVar4 = get_nr_class(model_);
  local_8c = get_nr_feature(model_);
  dVar15 = 0.0;
  local_90 = (local_8c + 1) - (uint)(model_->bias < 0.0);
  uVar12 = 0;
  local_b0 = (FILE *)output;
  if (flag_predict_probability == 0) {
    __ptr_00 = (void *)0x0;
  }
  else {
    iVar5 = check_probability_model();
    if (iVar5 == 0) {
LAB_001028ca:
      fwrite("probability output is only supported for logistic regression\n",0x3d,1,_stderr);
      exit(1);
    }
    __ptr = malloc((long)(int)uVar4 * 4);
    get_labels(model_,__ptr);
    __ptr_00 = malloc((long)(int)uVar4 * 8);
    fwrite("labels",6,1,(FILE *)output);
    if ((int)uVar4 < 1) {
      uVar4 = 0;
    }
    for (uVar13 = 0; uVar4 != uVar13; uVar13 = uVar13 + 1) {
      fprintf(local_b0," %d",(ulong)*(uint *)((long)__ptr + uVar13 * 4));
    }
    fputc(10,local_b0);
    free(__ptr);
  }
  max_line_len = 0x400;
  line = (char *)malloc(0x400);
  local_58 = 0.0;
  dStack_50 = 0.0;
  local_b4 = 0;
  local_68 = 0.0;
  dStack_60 = 0.0;
  local_78 = 0.0;
  dStack_70 = 0.0;
  iVar5 = 0x400;
  local_88 = __ptr_00;
  while( true ) {
    pcVar7 = fgets(line,iVar5,local_80);
    iVar5 = (int)uVar12;
    if (pcVar7 == (char *)0x0) break;
    do {
      pcVar7 = line;
      pcVar8 = strrchr(line,10);
      if (pcVar8 != (char *)0x0) break;
      lVar14 = (long)max_line_len;
      iVar6 = (int)(lVar14 * 2);
      max_line_len = iVar6;
      pcVar7 = (char *)realloc(pcVar7,lVar14 * 2);
      line = pcVar7;
      sVar9 = strlen(pcVar7);
      pcVar8 = fgets(pcVar7 + (int)sVar9,iVar6 - (int)sVar9,local_80);
      pcVar7 = line;
    } while (pcVar8 != (char *)0x0);
    if (pcVar7 == (char *)0x0) break;
    pcVar7 = strtok(pcVar7," \t\n");
    if (pcVar7 == (char *)0x0) {
LAB_001028c1:
      exit_input_error((int)uVar12 + 1);
      goto LAB_001028ca;
    }
    dVar15 = strtod(pcVar7,&endptr);
    if ((endptr == pcVar7) || (*endptr != '\0')) {
LAB_001028b6:
      exit_input_error(iVar5 + 1);
      goto LAB_001028c1;
    }
    uVar4 = 0;
    uVar12 = 0;
    local_48 = dVar15;
    while( true ) {
      lVar14 = (long)max_nr_attr;
      if (max_nr_attr + -2 <= (int)uVar4) {
        max_nr_attr = max_nr_attr * 2;
        x = (feature_node *)realloc(x,lVar14 << 5);
      }
      pcVar7 = strtok((char *)0x0,":");
      pcVar8 = strtok((char *)0x0," \t");
      __ptr_00 = local_88;
      __stream = local_b0;
      pfVar3 = x;
      pmVar2 = model_;
      if (pcVar8 == (char *)0x0) break;
      local_a8 = (double)CONCAT44(local_a8._4_4_,uVar4);
      piVar10 = __errno_location();
      *piVar10 = 0;
      uVar13 = strtol(pcVar7,&endptr,10);
      x[uVar4].index = (int)uVar13;
      if ((((endptr == pcVar7) || (*piVar10 != 0)) || (*endptr != '\0')) ||
         ((int)uVar13 <= (int)uVar12)) goto LAB_001028b6;
      *piVar10 = 0;
      dVar15 = strtod(pcVar8,&endptr);
      pfVar3 = x;
      x[uVar4].value = dVar15;
      if (((endptr == pcVar8) || (*piVar10 != 0)) ||
         ((cVar1 = *endptr, (long)cVar1 != 0 &&
          (ppuVar11 = __ctype_b_loc(),
          (*(byte *)((long)*ppuVar11 + (long)cVar1 * 2 + 1) & 0x20) == 0)))) goto LAB_001028b6;
      uVar4 = local_a8._0_4_ + (uint)(pfVar3[uVar4].index <= local_8c);
      uVar12 = uVar13 & 0xffffffff;
    }
    dVar15 = model_->bias;
    if (0.0 <= dVar15) {
      x[uVar4].index = local_90;
      pfVar3[uVar4].value = dVar15;
      uVar4 = uVar4 + 1;
    }
    pfVar3[(int)uVar4].index = -1;
    if (flag_predict_probability == 0) {
      local_a8 = (double)predict();
      dStack_a0 = extraout_XMM0_Qb_00;
      fprintf(__stream,"%g\n");
      __ptr_00 = local_88;
    }
    else {
      local_a8 = (double)predict_probability(pmVar2,pfVar3,local_88);
      dStack_a0 = extraout_XMM0_Qb;
      fprintf(__stream,"%g");
      for (lVar14 = 0; lVar14 < model_->nr_class; lVar14 = lVar14 + 1) {
        fprintf(__stream," %g",*(undefined8 *)((long)__ptr_00 + lVar14 * 8));
      }
      fputc(10,__stream);
    }
    local_b4 = local_b4 + (local_a8 == local_48);
    local_68 = local_68 + local_a8;
    dStack_60 = dStack_60 + local_48;
    local_78 = local_78 + local_48 * local_48;
    dStack_70 = dStack_70 + (local_a8 - local_48) * (local_a8 - local_48);
    local_58 = local_58 + local_a8 * local_a8;
    dStack_50 = dStack_50 + local_a8 * local_48;
    uVar12 = (ulong)(iVar5 + 1);
    dVar15 = local_48;
    iVar5 = max_line_len;
  }
  iVar6 = check_regression_model(model_);
  if (iVar6 == 0) {
    (*info)("Accuracy = %g%% (%d/%d)\n",((double)(int)local_b4 / (double)iVar5) * 100.0,
            (ulong)local_b4,uVar12);
  }
  else {
    local_a8 = (double)iVar5;
    dStack_a0 = dVar15;
    (*info)("Mean squared error = %g (regression)\n",dStack_70 / local_a8);
    dVar15 = local_a8 * dStack_50 - local_68 * dStack_60;
    (*info)("Squared correlation coefficient = %g (regression)\n",
            (dVar15 * dVar15) /
            ((local_78 * local_a8 - dStack_60 * dStack_60) *
            (local_a8 * local_58 - local_68 * local_68)));
  }
  if (flag_predict_probability == 0) {
    return;
  }
  free(__ptr_00);
  return;
}

Assistant:

void do_predict(FILE *input, FILE *output)
{
	int correct = 0;
	int total = 0;
	double error = 0;
	double sump = 0, sumt = 0, sumpp = 0, sumtt = 0, sumpt = 0;

	int nr_class=get_nr_class(model_);
	double *prob_estimates=NULL;
	int j, n;
	int nr_feature=get_nr_feature(model_);
	if(model_->bias>=0)
		n=nr_feature+1;
	else
		n=nr_feature;

	if(flag_predict_probability)
	{
		int *labels;

		if(!check_probability_model(model_))
		{
			fprintf(stderr, "probability output is only supported for logistic regression\n");
			exit(1);
		}

		labels=(int *) malloc(nr_class*sizeof(int));
		get_labels(model_,labels);
		prob_estimates = (double *) malloc(nr_class*sizeof(double));
		fprintf(output,"labels");
		for(j=0;j<nr_class;j++)
			fprintf(output," %d",labels[j]);
		fprintf(output,"\n");
		free(labels);
	}

	max_line_len = 1024;
	line = (char *)malloc(max_line_len*sizeof(char));
	while(readline(input) != NULL)
	{
		int i = 0;
		double target_label, predict_label;
		char *idx, *val, *label, *endptr;
		int inst_max_index = 0; // strtol gives 0 if wrong format

		label = strtok(line," \t\n");
		if(label == NULL) // empty line
			exit_input_error(total+1);

		target_label = strtod(label,&endptr);
		if(endptr == label || *endptr != '\0')
			exit_input_error(total+1);

		while(1)
		{
			if(i>=max_nr_attr-2)	// need one more for index = -1
			{
				max_nr_attr *= 2;
				x = (struct feature_node *) realloc(x,max_nr_attr*sizeof(struct feature_node));
			}

			idx = strtok(NULL,":");
			val = strtok(NULL," \t");

			if(val == NULL)
				break;
			errno = 0;
			x[i].index = (int) strtol(idx,&endptr,10);
			if(endptr == idx || errno != 0 || *endptr != '\0' || x[i].index <= inst_max_index)
				exit_input_error(total+1);
			else
				inst_max_index = x[i].index;

			errno = 0;
			x[i].value = strtod(val,&endptr);
			if(endptr == val || errno != 0 || (*endptr != '\0' && !isspace(*endptr)))
				exit_input_error(total+1);

			// feature indices larger than those in training are not used
			if(x[i].index <= nr_feature)
				++i;
		}

		if(model_->bias>=0)
		{
			x[i].index = n;
			x[i].value = model_->bias;
			i++;
		}
		x[i].index = -1;

		if(flag_predict_probability)
		{
			int j;
			predict_label = predict_probability(model_,x,prob_estimates);
			fprintf(output,"%g",predict_label);
			for(j=0;j<model_->nr_class;j++)
				fprintf(output," %g",prob_estimates[j]);
			fprintf(output,"\n");
		}
		else
		{
			predict_label = predict(model_,x);
			fprintf(output,"%g\n",predict_label);
		}

		if(predict_label == target_label)
			++correct;
		error += (predict_label-target_label)*(predict_label-target_label);
		sump += predict_label;
		sumt += target_label;
		sumpp += predict_label*predict_label;
		sumtt += target_label*target_label;
		sumpt += predict_label*target_label;
		++total;
	}
	if(check_regression_model(model_))
	{
		info("Mean squared error = %g (regression)\n",error/total);
		info("Squared correlation coefficient = %g (regression)\n",
			((total*sumpt-sump*sumt)*(total*sumpt-sump*sumt))/
			((total*sumpp-sump*sump)*(total*sumtt-sumt*sumt))
			);
	}
	else
		info("Accuracy = %g%% (%d/%d)\n",(double) correct/total*100,correct,total);
	if(flag_predict_probability)
		free(prob_estimates);
}